

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddCheckConstraint(Parse *pParse,Expr *pCheckExpr,char *zStart,char *zEnd)

{
  Table *pTVar1;
  int iVar2;
  ExprList *pEVar3;
  undefined1 local_48 [8];
  Token t;
  sqlite3 *db;
  Table *pTab;
  char *zEnd_local;
  char *zStart_local;
  Expr *pCheckExpr_local;
  Parse *pParse_local;
  
  pTVar1 = pParse->pNewTable;
  t._8_8_ = pParse->db;
  if (((pTVar1 == (Table *)0x0) || (pParse->eParseMode == '\x01')) ||
     (iVar2 = sqlite3BtreeIsReadonly
                        (((sqlite3 *)t._8_8_)->aDb[(((sqlite3 *)t._8_8_)->init).iDb].pBt),
     iVar2 != 0)) {
    sqlite3ExprDelete(pParse->db,pCheckExpr);
  }
  else {
    pEVar3 = sqlite3ExprListAppend(pParse,pTVar1->pCheck,pCheckExpr);
    pTVar1->pCheck = pEVar3;
    if ((pParse->constraintName).n == 0) {
      zEnd_local = zStart + 1;
      while (pTab = (Table *)zEnd, (""[(byte)*zEnd_local] & 1) != 0) {
        zEnd_local = zEnd_local + 1;
      }
      while ((""[*(byte *)((long)&pTab[-1].pSchema + 7)] & 1) != 0) {
        pTab = (Table *)((long)&pTab[-1].pSchema + 7);
      }
      local_48 = (undefined1  [8])zEnd_local;
      t.z._0_4_ = (int)pTab - (int)zEnd_local;
      sqlite3ExprListSetName(pParse,pTVar1->pCheck,(Token *)local_48,1);
    }
    else {
      sqlite3ExprListSetName(pParse,pTVar1->pCheck,&pParse->constraintName,1);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddCheckConstraint(
  Parse *pParse,      /* Parsing context */
  Expr *pCheckExpr,   /* The check expression */
  const char *zStart, /* Opening "(" */
  const char *zEnd    /* Closing ")" */
){
#ifndef SQLITE_OMIT_CHECK
  Table *pTab = pParse->pNewTable;
  sqlite3 *db = pParse->db;
  if( pTab && !IN_DECLARE_VTAB
   && !sqlite3BtreeIsReadonly(db->aDb[db->init.iDb].pBt)
  ){
    pTab->pCheck = sqlite3ExprListAppend(pParse, pTab->pCheck, pCheckExpr);
    if( pParse->constraintName.n ){
      sqlite3ExprListSetName(pParse, pTab->pCheck, &pParse->constraintName, 1);
    }else{
      Token t;
      for(zStart++; sqlite3Isspace(zStart[0]); zStart++){}
      while( sqlite3Isspace(zEnd[-1]) ){ zEnd--; }
      t.z = zStart;
      t.n = (int)(zEnd - t.z);
      sqlite3ExprListSetName(pParse, pTab->pCheck, &t, 1);
    }
  }else
#endif
  {
    sqlite3ExprDelete(pParse->db, pCheckExpr);
  }
}